

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

int run_test_condvar_4(void)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  worker_config_conflict wc;
  
  worker_config_init((worker_config_conflict *)&thread,1,condvar_signal,condvar_timedwait);
  iVar1 = uv_thread_create(&eval_a,worker,&thread);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0xd8,"uv_thread_create(&thread, worker, &wc)","==","0",(long)iVar1,"==",0);
    abort();
  }
  (*wc.signal_cond)((worker_config_conflict *)&thread,(int *)(wc.cond.__size + 0x2c));
  (*(code *)wc._160_8_)(&thread,&wc.use_broadcast);
  iVar1 = uv_thread_join(&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0xde,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  worker_config_destroy((worker_config_conflict *)&thread);
  return 0;
}

Assistant:

TEST_IMPL(condvar_4) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_timedwait);
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  wc.wait_cond(&wc, &wc.posted_1);
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT_OK(uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}